

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O1

xmlEntityPtr
xmlAddDtdEntity(xmlDocPtr doc,xmlChar *name,int type,xmlChar *ExternalID,xmlChar *SystemID,
               xmlChar *content)

{
  xmlDtdPtr dtd;
  _xmlNode *p_Var1;
  xmlEntityPtr pxVar2;
  char *msg;
  int code;
  
  if (doc == (xmlDocPtr)0x0) {
    msg = "xmlAddDtdEntity: document is NULL";
    code = 0x209;
  }
  else {
    dtd = doc->extSubset;
    if (dtd != (xmlDtdPtr)0x0) {
      pxVar2 = xmlAddEntity(dtd,name,type,ExternalID,SystemID,content);
      if (pxVar2 == (xmlEntityPtr)0x0) {
        return (xmlEntityPtr)0x0;
      }
      pxVar2->parent = dtd;
      pxVar2->doc = dtd->doc;
      p_Var1 = dtd->last;
      if (p_Var1 != (_xmlNode *)0x0) {
        p_Var1->next = (_xmlNode *)pxVar2;
        pxVar2->prev = p_Var1;
        dtd->last = (_xmlNode *)pxVar2;
        return pxVar2;
      }
      dtd->last = (_xmlNode *)pxVar2;
      dtd->children = (_xmlNode *)pxVar2;
      return pxVar2;
    }
    msg = "xmlAddDtdEntity: document without external subset";
    code = 0x20a;
  }
  __xmlSimpleError(2,code,(xmlNodePtr)0x0,msg,(char *)0x0);
  return (xmlEntityPtr)0x0;
}

Assistant:

xmlEntityPtr
xmlAddDtdEntity(xmlDocPtr doc, const xmlChar *name, int type,
	        const xmlChar *ExternalID, const xmlChar *SystemID,
		const xmlChar *content) {
    xmlEntityPtr ret;
    xmlDtdPtr dtd;

    if (doc == NULL) {
	xmlEntitiesErr(XML_DTD_NO_DOC,
	        "xmlAddDtdEntity: document is NULL");
	return(NULL);
    }
    if (doc->extSubset == NULL) {
	xmlEntitiesErr(XML_DTD_NO_DTD,
	        "xmlAddDtdEntity: document without external subset");
	return(NULL);
    }
    dtd = doc->extSubset;
    ret = xmlAddEntity(dtd, name, type, ExternalID, SystemID, content);
    if (ret == NULL) return(NULL);

    /*
     * Link it to the DTD
     */
    ret->parent = dtd;
    ret->doc = dtd->doc;
    if (dtd->last == NULL) {
	dtd->children = dtd->last = (xmlNodePtr) ret;
    } else {
        dtd->last->next = (xmlNodePtr) ret;
	ret->prev = dtd->last;
	dtd->last = (xmlNodePtr) ret;
    }
    return(ret);
}